

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetMinReduction(void *arkode_mem,realtype eta_min)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = eta_min;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetMinReduction",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->etamin =
         (realtype)
         (-(ulong)(1.0 <= local_18) & 0x3fb999999999999a |
         ~-(ulong)(1.0 <= local_18) &
         (~-(ulong)(local_18 <= 0.0) & (ulong)local_18 |
         -(ulong)(local_18 <= 0.0) & 0x3fb999999999999a));
  }
  return iVar1;
}

Assistant:

int arkSetMinReduction(void *arkode_mem, realtype eta_min)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetMinReduction",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set allowed value, otherwise set default */
  if (eta_min >= ONE || eta_min <= ZERO) {
    hadapt_mem->etamin = ETAMIN;
  } else {
    hadapt_mem->etamin = eta_min;
  }

  return(ARK_SUCCESS);
}